

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.h
# Opt level: O0

type_conflict1 __thiscall llvm::StringRef::getAsInteger<int>(StringRef *this,uint Radix,int *Result)

{
  bool bVar1;
  longlong *in_R8;
  StringRef Str;
  long local_30;
  longlong LLVal;
  int *Result_local;
  StringRef *pSStack_18;
  uint Radix_local;
  StringRef *this_local;
  
  Str.Length._0_4_ = Radix;
  Str.Data = (char *)this->Length;
  Str.Length._4_4_ = 0;
  LLVal = (longlong)Result;
  Result_local._4_4_ = Radix;
  pSStack_18 = this;
  bVar1 = getAsSignedInteger((llvm *)this->Data,Str,(uint)&local_30,in_R8);
  if ((bVar1) || ((int)local_30 != local_30)) {
    this_local._7_1_ = true;
  }
  else {
    *(int *)LLVal = (int)local_30;
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

typename std::enable_if<std::numeric_limits<T>::is_signed, bool>::type
    getAsInteger(unsigned Radix, T &Result) const {
      long long LLVal;
      if (getAsSignedInteger(*this, Radix, LLVal) ||
            static_cast<T>(LLVal) != LLVal)
        return true;
      Result = LLVal;
      return false;
    }